

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_D3D_SETP(Context *ctx)

{
  char *pcVar1;
  char op [16];
  char acStack_28 [24];
  
  if ((ulong)ctx->instruction_controls < 7) {
    pcVar1 = *(char **)(get_D3D_comparison_string_comps + (ulong)ctx->instruction_controls * 8);
  }
  else {
    failf(ctx,"%s","unknown comparison control");
    pcVar1 = "";
  }
  snprintf(acStack_28,0x10,"setp%s",pcVar1);
  emit_D3D_opcode_dss(ctx,acStack_28);
  return;
}

Assistant:

static void emit_D3D_SETP(Context *ctx)
{
    char op[16];
    snprintf(op, sizeof (op), "setp%s", get_D3D_comparison_string(ctx));
    emit_D3D_opcode_dss(ctx, op);
}